

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rpc_client.hpp
# Opt level: O0

undefined8 __thiscall rest_rpc::req_result::as<std::__cxx11::string>(req_result *this)

{
  bool bVar1;
  ulong uVar2;
  logic_error *this_00;
  string *in_RSI;
  undefined8 in_RDI;
  string err_msg;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_ffffffffffffff68;
  basic_string_view<char,_std::char_traits<char>_> *in_stack_ffffffffffffff70;
  string_view in_stack_ffffffffffffffb0;
  string local_40 [32];
  string_view in_stack_ffffffffffffffe0;
  
  nonstd::sv_lite::basic_string_view<char,std::char_traits<char>>::
  basic_string_view<std::allocator<char>>(in_stack_ffffffffffffff70,in_stack_ffffffffffffff68);
  bVar1 = has_error(in_stack_ffffffffffffffb0);
  if (!bVar1) {
    nonstd::sv_lite::basic_string_view<char,std::char_traits<char>>::
    basic_string_view<std::allocator<char>>(in_stack_ffffffffffffff70,in_stack_ffffffffffffff68);
    get_result<std::__cxx11::string>(in_stack_ffffffffffffffe0);
    return in_RDI;
  }
  uVar2 = std::__cxx11::string::empty();
  if ((uVar2 & 1) == 0) {
    nonstd::sv_lite::basic_string_view<char,std::char_traits<char>>::
    basic_string_view<std::allocator<char>>(in_stack_ffffffffffffff70,in_stack_ffffffffffffff68);
    get_error_msg_abi_cxx11_(in_stack_ffffffffffffffe0);
  }
  else {
    std::__cxx11::string::string(local_40,in_RSI);
  }
  this_00 = (logic_error *)__cxa_allocate_exception(0x10);
  std::logic_error::logic_error(this_00,local_40);
  __cxa_throw(this_00,&std::logic_error::typeinfo,std::logic_error::~logic_error);
}

Assistant:

T as() {
    if (has_error(data_)) {
      std::string err_msg = data_.empty() ? data_ : get_error_msg(data_);
      throw std::logic_error(err_msg);
    }

    return get_result<T>(data_);
  }